

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O1

void duckdb::LogicalUpdate::BindExtraColumns
               (TableCatalogEntry *table,LogicalGet *get,LogicalProjection *proj,
               LogicalUpdate *update,physical_index_set_t *bound_columns)

{
  pointer puVar1;
  idx_t iVar2;
  pointer puVar3;
  pointer pCVar4;
  pointer pCVar5;
  iterator __position;
  LogicalUpdate *pLVar6;
  reference pvVar7;
  __node_base_ptr p_Var8;
  LogicalType *pLVar9;
  tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> tVar10;
  vector<duckdb::ColumnIndex,_true> *pvVar11;
  size_type sVar12;
  _Hash_node_base *p_Var13;
  size_type __n;
  ColumnBinding binding;
  ColumnBinding binding_00;
  physical_index_set_t found_columns;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_d0;
  _Hash_node_base *local_c8;
  vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>> *local_c0;
  LogicalProjection *local_b8;
  TableCatalogEntry *local_b0;
  LogicalGet *local_a8;
  LogicalUpdate *local_a0;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_98;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_90;
  ColumnDefinition *local_88;
  LogicalType local_80;
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  if (1 < (bound_columns->_M_h)._M_element_count) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_c0 = (vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>> *)
               &update->columns;
    local_b8 = proj;
    local_b0 = table;
    local_a8 = get;
    if ((update->columns).
        super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (update->columns).
        super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar12 = 0;
    }
    else {
      sVar12 = 0;
      __n = 0;
      do {
        pvVar7 = vector<duckdb::PhysicalIndex,_true>::operator[]
                           ((vector<duckdb::PhysicalIndex,_true> *)local_c0,__n);
        p_Var8 = ::std::
                 _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::_M_find_before_node
                           (&bound_columns->_M_h,
                            pvVar7->index % (bound_columns->_M_h)._M_bucket_count,pvVar7,
                            pvVar7->index);
        if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
          pvVar7 = vector<duckdb::PhysicalIndex,_true>::operator[]
                             ((vector<duckdb::PhysicalIndex,_true> *)local_c0,__n);
          local_80._0_8_ = &local_68;
          ::std::
          _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::PhysicalIndex_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                    ((_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_68,pvVar7,&local_80);
          sVar12 = sVar12 + 1;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(update->columns).
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   .
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(update->columns).
                                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   .
                                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (((sVar12 != 0) && (sVar12 != (bound_columns->_M_h)._M_element_count)) &&
       (p_Var13 = (bound_columns->_M_h)._M_before_begin._M_nxt, p_Var13 != (_Hash_node_base *)0x0))
    {
      local_b0 = (TableCatalogEntry *)&local_b0->columns;
      local_90 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&(update->super_LogicalOperator).expressions;
      local_98 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&(local_b8->super_LogicalOperator).expressions;
      local_a0 = update;
      do {
        local_c8 = p_Var13 + 1;
        p_Var8 = ::std::
                 _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::_M_find_before_node
                           (&local_68,(ulong)p_Var13[1]._M_nxt % local_68._M_bucket_count,
                            (key_type *)local_c8,(__hash_code)p_Var13[1]._M_nxt);
        if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
          local_88 = ColumnList::GetColumn((ColumnList *)local_b0,(PhysicalIndex)local_c8->_M_nxt);
          pLVar9 = ColumnDefinition::Type(local_88);
          puVar1 = (local_b8->super_LogicalOperator).expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          iVar2 = local_b8->table_index;
          puVar3 = (local_b8->super_LogicalOperator).expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          tVar10.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               operator_new(0x70);
          LogicalType::LogicalType(&local_80,pLVar9);
          binding.column_index = (long)puVar1 - (long)puVar3 >> 3;
          binding.table_index = iVar2;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)
                     tVar10.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,&local_80,
                     binding,0);
          LogicalType::~LogicalType(&local_80);
          local_d0._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               tVar10.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    (local_90,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_d0);
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_d0._M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
          {
            (**(code **)(*(long *)local_d0._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                        8))();
          }
          pLVar9 = ColumnDefinition::Type(local_88);
          iVar2 = local_a8->table_index;
          pvVar11 = LogicalGet::GetColumnIds(local_a8);
          pCVar4 = (pvVar11->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                   ).super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pCVar5 = (pvVar11->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                   ).super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          tVar10.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               operator_new(0x70);
          LogicalType::LogicalType(&local_80,pLVar9);
          binding_00.column_index = (long)pCVar4 - (long)pCVar5 >> 5;
          binding_00.table_index = iVar2;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)
                     tVar10.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,&local_80,
                     binding_00,0);
          LogicalType::~LogicalType(&local_80);
          local_d0._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               tVar10.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    (local_98,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_d0);
          pLVar6 = local_a0;
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_d0._M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
          {
            (**(code **)(*(long *)local_d0._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                        8))();
          }
          LogicalGet::AddColumnId(local_a8,(column_t)local_c8->_M_nxt);
          __position._M_current =
               (pLVar6->columns).
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pLVar6->columns).
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>>::
            _M_realloc_insert<duckdb::PhysicalIndex_const&>
                      (local_c0,__position,(PhysicalIndex *)local_c8);
          }
          else {
            (__position._M_current)->index = (idx_t)local_c8->_M_nxt;
            (pLVar6->columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    ::std::
    _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void LogicalUpdate::BindExtraColumns(TableCatalogEntry &table, LogicalGet &get, LogicalProjection &proj,
                                     LogicalUpdate &update, physical_index_set_t &bound_columns) {
	if (bound_columns.size() <= 1) {
		return;
	}
	idx_t found_column_count = 0;
	physical_index_set_t found_columns;
	for (idx_t i = 0; i < update.columns.size(); i++) {
		if (bound_columns.find(update.columns[i]) != bound_columns.end()) {
			// this column is referenced in the CHECK constraint
			found_column_count++;
			found_columns.insert(update.columns[i]);
		}
	}
	if (found_column_count > 0 && found_column_count != bound_columns.size()) {
		// columns in this CHECK constraint were referenced, but not all were part of the UPDATE
		// add them to the scan and update set
		for (auto &check_column_id : bound_columns) {
			if (found_columns.find(check_column_id) != found_columns.end()) {
				// column is already projected
				continue;
			}
			// column is not projected yet: project it by adding the clause "i=i" to the set of updated columns
			auto &column = table.GetColumns().GetColumn(check_column_id);
			update.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    column.Type(), ColumnBinding(proj.table_index, proj.expressions.size())));
			proj.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    column.Type(), ColumnBinding(get.table_index, get.GetColumnIds().size())));
			get.AddColumnId(check_column_id.index);
			update.columns.push_back(check_column_id);
		}
	}
}